

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O0

uint32_t net_uv::net_tcp_getListenPort(uv_tcp_t *handle)

{
  ushort uVar1;
  int iVar2;
  sockaddr *name;
  sockaddr_in *addr_in_1;
  sockaddr_in6 *addr_in;
  uint32_t outPort;
  int32_t r;
  sockaddr *client_addr;
  uv_tcp_t *puStack_10;
  int32_t client_addr_length;
  uv_tcp_t *handle_local;
  
  client_addr._4_4_ = 0x38;
  puStack_10 = handle;
  name = (sockaddr *)malloc(0x38);
  memset(name,0,(long)client_addr._4_4_);
  iVar2 = uv_tcp_getsockname(puStack_10,name,(int *)((long)&client_addr + 4));
  addr_in._0_4_ = 0;
  if (iVar2 == 0) {
    if (name->sa_family == 10) {
      uVar1 = ntohs(*(uint16_t *)name->sa_data);
    }
    else {
      uVar1 = ntohs(*(uint16_t *)name->sa_data);
    }
    addr_in._0_4_ = (uint32_t)uVar1;
  }
  free(name);
  return (uint32_t)addr_in;
}

Assistant:

uint32_t net_tcp_getListenPort(const uv_tcp_t* handle)
{
	int32_t client_addr_length = sizeof(sockaddr_in6) * 2;
	struct sockaddr* client_addr = (struct sockaddr*)fc_malloc(client_addr_length);
	memset(client_addr, 0, client_addr_length);

	int32_t r = uv_tcp_getsockname(handle, client_addr, &client_addr_length);

	uint32_t outPort = 0;

	if (r == 0)
	{
		if (client_addr->sa_family == AF_INET6)
		{
			const struct sockaddr_in6* addr_in = (const struct sockaddr_in6*) client_addr;
			outPort = ntohs(addr_in->sin6_port);
		}
		else
		{
			const struct sockaddr_in* addr_in = (const struct sockaddr_in*) client_addr;
			outPort = ntohs(addr_in->sin_port);
		}
	}
	fc_free(client_addr);

	return outPort;
}